

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O0

ScenarioUpperBound * __thiscall
despot::SimpleRockSample::CreateScenarioUpperBound
          (SimpleRockSample *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  TrivialParticleUpperBound *this_00;
  SimpleRockSampleParticleUpperBound *this_01;
  ostream *poVar2;
  ScenarioUpperBound *bound;
  string *particle_bound_name_local;
  string *name_local;
  SimpleRockSample *this_local;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if ((!bVar1) && (bVar1 = std::operator==(name,"DEFAULT"), !bVar1)) {
    bVar1 = std::operator==(name,"MAX");
    if (bVar1) {
      this_01 = (SimpleRockSampleParticleUpperBound *)operator_new(0x20);
      SimpleRockSampleParticleUpperBound::SimpleRockSampleParticleUpperBound
                (this_01,&this->super_DSPOMDP);
      return (ScenarioUpperBound *)this_01;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported base upper bound: ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  this_00 = (TrivialParticleUpperBound *)operator_new(0x10);
  despot::TrivialParticleUpperBound::TrivialParticleUpperBound(this_00,&this->super_DSPOMDP);
  return (ScenarioUpperBound *)this_00;
}

Assistant:

ScenarioUpperBound* SimpleRockSample::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	ScenarioUpperBound* bound = NULL;
	if (name == "TRIVIAL" || name == "DEFAULT") {
		bound = new TrivialParticleUpperBound(this);
	} else if (name == "MAX") {
		bound = new SimpleRockSampleParticleUpperBound(this);
	} else {
		cerr << "Unsupported base upper bound: " << name << endl;
		exit(0);
	}
	return bound;
}